

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

sherwood_v3_entry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* ska::detailv3::empty_default_table<std::__cxx11::string>(void)

{
  if (empty_default_table<std::__cxx11::string>()::result_abi_cxx11_ == '\0') {
    empty_default_table<std::__cxx11::string>();
  }
  return empty_default_table<std::__cxx11::string>()::result_abi_cxx11_;
}

Assistant:

sherwood_v3_entry<T> * empty_default_table()
{
    static constexpr int8_t special_end_value = 0;
    static sherwood_v3_entry<T> result[min_lookups] = { {}, {}, {}, {special_end_value} };
    return result;
}